

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::purge(PtexReader *this)

{
  _Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> local_28;
  
  prune(this);
  if (this->_constdata != (uint8_t *)0x0) {
    operator_delete__(this->_constdata);
    this->_constdata = (uint8_t *)0x0;
  }
  local_28._M_impl.super__Vector_impl_data._M_start =
       (this->_faceinfo).
       super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (this->_faceinfo).
       super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_faceinfo).
       super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->_faceinfo).super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_faceinfo).super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_faceinfo).super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::~_Vector_base
            (&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_levelinfo).
                super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_levelinfo).
                super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_levelinfo).
                super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_levelinfo).
  super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>::~_Vector_base
            ((_Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_> *)
             &local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_levels).
                super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_levels).
                super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_levels).
                super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_levels).
  super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_levels).
  super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_levels).
  super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>::
  ~_Vector_base((_Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                 *)&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_metaedits).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_metaedits).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_metaedits).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_metaedits).
  super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  ::~_Vector_base((_Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                   *)&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_faceedits).
                super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->_faceedits).
                super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->_faceedits).
                super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_faceedits).
  super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
  ::~_Vector_base((_Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                   *)&local_28);
  closeFP(this);
  this->_ok = true;
  this->_needToOpen = true;
  this->_pendingPurge = false;
  this->_baseMemUsed = 0x2c8;
  this->_memUsed = 0x2c8;
  return;
}

Assistant:

void PtexReader::purge()
{
    // free all dynamic data
    prune();
    if (_constdata) {delete [] _constdata; _constdata = 0; }
    std::vector<FaceInfo>().swap(_faceinfo);
    std::vector<uint32_t>().swap(_rfaceids);
    std::vector<LevelInfo>().swap(_levelinfo);
    std::vector<FilePos>().swap(_levelpos);
    std::vector<Level*>().swap(_levels);
    std::vector<MetaEdit>().swap(_metaedits);
    std::vector<FaceEdit>().swap(_faceedits);
    closeFP();

    // reset initial state
    _ok = true;
    _needToOpen = true;
    _pendingPurge = false;
    _memUsed = _baseMemUsed = sizeof(*this);
}